

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall
cs_impl::any::make_constant<cs::range_type,int,cs::numeric_const&,int>
          (any *this,int *args,numeric *args_1,int *args_2)

{
  bool bVar1;
  int iVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  baseHolder *pbVar5;
  proxy *ppVar6;
  
  if ((DAT_00268928 == 0) || (cs::global_thread_counter != 0)) {
    pbVar5 = (baseHolder *)operator_new(0x70);
  }
  else {
    pbVar5 = *(baseHolder **)
              (&holder<std::shared_ptr<cs::name_space>>::allocator + DAT_00268928 * 8);
    DAT_00268928 = DAT_00268928 + -1;
  }
  pbVar5->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_0025ded0;
  pp_Var3 = (_func_int **)(args_1->data)._int;
  pp_Var4 = *(_func_int ***)((long)&args_1->data + 8);
  bVar1 = args_1->type;
  iVar2 = *args_2;
  pbVar5[2]._vptr_baseHolder = (_func_int **)(long)*args;
  *(undefined1 *)&pbVar5[4]._vptr_baseHolder = 1;
  pbVar5[6]._vptr_baseHolder = pp_Var3;
  pbVar5[7]._vptr_baseHolder = pp_Var4;
  *(bool *)&pbVar5[8]._vptr_baseHolder = bVar1;
  pbVar5[10]._vptr_baseHolder = (_func_int **)(long)iVar2;
  *(undefined1 *)&pbVar5[0xc]._vptr_baseHolder = 1;
  if ((DAT_002680d0 == 0) || (cs::global_thread_counter != 0)) {
    ppVar6 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar6 = (proxy *)(&cs::null_pointer)[DAT_002680d0];
    DAT_002680d0 = DAT_002680d0 + -1;
  }
  ppVar6->is_rvalue = false;
  ppVar6->protect_level = 2;
  ppVar6->refcount = 1;
  ppVar6->data = pbVar5;
  this->mDat = ppVar6;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}